

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[36],int,char[32],int,char[14]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [36],int *Args_1,
          char (*Args_2) [32],int *Args_3,char (*Args_4) [14])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [14];
  int *Args_local_3;
  char (*Args_local_2) [32];
  int *Args_local_1;
  char (*Args_local) [36];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[36],int,char[32],int,char[14]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [36])this,(int *)Args,(char (*) [32])Args_1,(int *)Args_2,
             (char (*) [14])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}